

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_len_4to8_64b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u64 h64;
  XXH64_hash_t XVar1;
  xxh_u32 in_ECX;
  xxh_u64 keyed;
  xxh_u64 input64;
  xxh_u64 bitflip;
  xxh_u32 input2;
  xxh_u32 input1;
  xxh_u64 in_stack_ffffffffffffffa8;
  
  XXH_swap32(in_ECX);
  XXH_readLE32((void *)0x10a7b1);
  XXH_readLE32((void *)0x10a7c8);
  h64 = XXH_readLE64((void *)0x10a7da);
  XXH_readLE64((void *)0x10a7ed);
  XVar1 = XXH3_rrmxmx(h64,in_stack_ffffffffffffffa8);
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH_PUREF XXH64_hash_t
XXH3_len_4to8_64b(const xxh_u8* input, size_t len, const xxh_u8* secret, XXH64_hash_t seed)
{
    XXH_ASSERT(input != NULL);
    XXH_ASSERT(secret != NULL);
    XXH_ASSERT(4 <= len && len <= 8);
    seed ^= (xxh_u64)XXH_swap32((xxh_u32)seed) << 32;
    {   xxh_u32 const input1 = XXH_readLE32(input);
        xxh_u32 const input2 = XXH_readLE32(input + len - 4);
        xxh_u64 const bitflip = (XXH_readLE64(secret+8) ^ XXH_readLE64(secret+16)) - seed;
        xxh_u64 const input64 = input2 + (((xxh_u64)input1) << 32);
        xxh_u64 const keyed = input64 ^ bitflip;
        return XXH3_rrmxmx(keyed, len);
    }
}